

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_p.h
# Opt level: O2

int __thiscall
QSharedDataPointer<QLocalePrivate>::clone
          (QSharedDataPointer<QLocalePrivate> *this,__fn *__fn,void *__child_stack,int __flags,
          void *__arg,...)

{
  Int IVar1;
  QLocalePrivate *pQVar2;
  qsizetype qVar3;
  undefined8 *puVar4;
  
  puVar4 = (undefined8 *)operator_new(0x20);
  pQVar2 = (this->d).ptr;
  qVar3 = pQVar2->m_index;
  IVar1 = (pQVar2->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
          super_QFlagsStorage<QLocale::NumberOption>.i;
  *puVar4 = pQVar2->m_data;
  *(undefined4 *)(puVar4 + 1) = 0;
  puVar4[2] = qVar3;
  *(Int *)(puVar4 + 3) = IVar1;
  return (int)puVar4;
}

Assistant:

inline QLocalePrivate *QSharedDataPointer<QLocalePrivate>::clone()
{
    // cannot use QLocalePrivate's copy constructor
    // since it is deleted in C++11
    return new QLocalePrivate(d->m_data, d->m_index, d->m_numberOptions);
}